

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test2D.cpp
# Opt level: O3

bool testRandom(void)

{
  int iVar1;
  DNN_NUMERIC extraout_XMM0_Qa;
  DNN_NUMERIC extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  vector<long,_std::allocator<long>_> label;
  vector<double,_std::allocator<double>_> data;
  vector<long,_std::allocator<long>_> local_68;
  vector<double,_std::allocator<double>_> local_48;
  DNN_NUMERIC local_30;
  DNN_NUMERIC local_28;
  
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                      ,"localTestRandom",0x124,"Test Random - Start");
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  iVar1 = 0x28;
  do {
    tfs::random();
    local_28 = extraout_XMM0_Qa;
    tfs::random();
    local_30 = extraout_XMM0_Qa_00;
    tfs::random();
    tfs::setData(&local_48,&local_68,local_28,local_30,(ulong)(0.5 < extraout_XMM0_Qa_01));
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  tfs::localTest2d(&local_48,&local_68);
  tfs::report_message("Info ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                      ,"localTestRandom",300,"Test Random - End");
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

static bool
    localTestRandom( void ) {
        log_info( "Test Random - Start" );
        std::vector< DNN_NUMERIC > data;    // x,y pairs
        std::vector< DNN_INTEGER > label;   // binary labels.
        
        setUpDataRandom( data, label, 40 );
        
        localTest2d( data, label );
        
        log_info( "Test Random - End" );
        return true;
    }